

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_smooth.c
# Opt level: O0

REF_STATUS ref_smooth_tet_improve(REF_GRID ref_grid,REF_INT node)

{
  REF_NODE pRVar1;
  REF_INTERP pRVar2;
  bool bVar3;
  bool bVar4;
  uint uVar5;
  uint uVar6;
  bool local_ea;
  bool local_e9;
  int local_e4;
  int local_e0;
  int local_dc;
  int local_d8;
  int local_d4;
  REF_STATUS ref_private_macro_code_rxs_1;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rxs;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_BOOL accept;
  REF_BOOL pliant_smoothing;
  REF_INTERP ref_interp;
  REF_INT interp_guess;
  REF_STATUS interp_status;
  REF_INT ixyz;
  REF_DBL max_ratio;
  REF_DBL min_ratio;
  REF_DBL quality;
  REF_DBL quality0;
  REF_DBL backoff;
  REF_DBL original [3];
  REF_DBL local_48;
  REF_DBL ideal [3];
  REF_INT tries;
  REF_NODE ref_node;
  REF_INT node_local;
  REF_GRID ref_grid_local;
  
  pRVar1 = ref_grid->node;
  pRVar2 = ref_grid->interp;
  if ((node < 0) || (ref_grid->cell[3]->ref_adj->nnode <= node)) {
    local_d4 = -1;
  }
  else {
    local_d4 = ref_grid->cell[3]->ref_adj->first[node];
  }
  if (local_d4 == -1) {
    if ((node < 0) || (ref_grid->cell[6]->ref_adj->nnode <= node)) {
      local_d8 = -1;
    }
    else {
      local_d8 = ref_grid->cell[6]->ref_adj->first[node];
    }
    if (local_d8 == -1) {
      if ((node < 0) || (ref_grid->cell[9]->ref_adj->nnode <= node)) {
        local_dc = -1;
      }
      else {
        local_dc = ref_grid->cell[9]->ref_adj->first[node];
      }
      if (local_dc == -1) {
        if ((node < 0) || (ref_grid->cell[10]->ref_adj->nnode <= node)) {
          local_e0 = -1;
        }
        else {
          local_e0 = ref_grid->cell[10]->ref_adj->first[node];
        }
        if (local_e0 == -1) {
          if ((node < 0) || (ref_grid->cell[0xb]->ref_adj->nnode <= node)) {
            local_e4 = -1;
          }
          else {
            local_e4 = ref_grid->cell[0xb]->ref_adj->first[node];
          }
          if (local_e4 == -1) {
            for (interp_guess = 0; interp_guess < 3; interp_guess = interp_guess + 1) {
              original[(long)interp_guess + -1] = pRVar1->real[interp_guess + node * 0xf];
            }
            ref_interp._4_4_ = -1;
            if ((pRVar2 != (REF_INTERP)0x0) && (pRVar2->continuously != 0)) {
              ref_interp._4_4_ = pRVar2->cell[node];
            }
            uVar5 = ref_smooth_tet_quality_around(ref_grid,node,&quality);
            if (uVar5 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                     ,0x5ba,"ref_smooth_tet_improve",(ulong)uVar5,"q");
              return uVar5;
            }
            uVar5 = ref_smooth_tet_ratio_around(ref_grid,node,&max_ratio,(REF_DBL *)&interp_status);
            if (uVar5 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                     ,0x5bc,"ref_smooth_tet_improve",(ulong)uVar5,"ratio");
              return uVar5;
            }
            bVar4 = false;
            if ((0.5 < quality) && (bVar4 = false, 0.5 < max_ratio)) {
              bVar4 = _interp_status < 2.0;
            }
            if (bVar4) {
              uVar5 = ref_smooth_tet_pliant(ref_grid,node,&local_48);
              if (uVar5 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                       ,0x5c0,"ref_smooth_tet_improve",(ulong)uVar5,"pliant");
                return uVar5;
              }
            }
            else {
              uVar5 = ref_smooth_tet_weighted_ideal(ref_grid,node,&local_48);
              if (uVar5 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                       ,0x5c2,"ref_smooth_tet_improve",(ulong)uVar5,"ideal");
                return uVar5;
              }
            }
            quality0 = 1.0;
            ideal[2]._4_4_ = 0;
            while( true ) {
              if (7 < ideal[2]._4_4_) {
                for (interp_guess = 0; interp_guess < 3; interp_guess = interp_guess + 1) {
                  pRVar1->real[interp_guess + node * 0xf] = original[(long)interp_guess + -1];
                }
                uVar5 = ref_metric_interpolate_node(ref_grid,node);
                if ((uVar5 != 0) && (uVar5 != 5)) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                         ,0x5e1,"ref_smooth_tet_improve",(ulong)uVar5,"interp");
                  return uVar5;
                }
                return 0;
              }
              for (interp_guess = 0; interp_guess < 3; interp_guess = interp_guess + 1) {
                pRVar1->real[interp_guess + node * 0xf] =
                     quality0 * ideal[(long)interp_guess + -1] +
                     (1.0 - quality0) * original[(long)interp_guess + -1];
              }
              uVar5 = ref_metric_interpolate_node(ref_grid,node);
              if ((uVar5 != 0) && (uVar5 != 5)) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                       ,0x5ca,"ref_smooth_tet_improve",(ulong)uVar5,
                       "ref_metric_interpolate_node failed");
                return uVar5;
              }
              uVar6 = ref_smooth_tet_quality_around(ref_grid,node,&min_ratio);
              if (uVar6 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                       ,0x5cb,"ref_smooth_tet_improve",(ulong)uVar6,"q");
                return uVar6;
              }
              uVar6 = ref_smooth_tet_ratio_around
                                (ref_grid,node,&max_ratio,(REF_DBL *)&interp_status);
              if (uVar6 != 0) break;
              bVar3 = false;
              if (uVar5 == 0) {
                bVar3 = ref_grid->adapt->post_min_ratio <= max_ratio;
              }
              local_ea = false;
              if (bVar3) {
                local_ea = _interp_status <= ref_grid->adapt->post_max_ratio;
              }
              if (bVar4) {
                local_e9 = (local_ea && quality * 0.9 < min_ratio) && 0.4 < min_ratio;
              }
              else {
                local_ea = local_ea && quality < min_ratio;
                local_e9 = local_ea;
              }
              if (local_e9) {
                return 0;
              }
              quality0 = quality0 * 0.5;
              if ((ref_interp._4_4_ != -1) && (uVar5 != 0)) {
                pRVar2->cell[node] = ref_interp._4_4_;
              }
              ideal[2]._4_4_ = ideal[2]._4_4_ + 1;
            }
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                   ,0x5cd,"ref_smooth_tet_improve",(ulong)uVar6,"ratio");
            return uVar6;
          }
        }
      }
      return 0;
    }
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_smooth_tet_improve(REF_GRID ref_grid, REF_INT node) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_INT tries;
  REF_DBL ideal[3], original[3];
  REF_DBL backoff, quality0, quality, min_ratio, max_ratio;
  REF_INT ixyz;
  REF_STATUS interp_status;
  REF_INT interp_guess;
  REF_INTERP ref_interp = ref_grid_interp(ref_grid);
  REF_BOOL pliant_smoothing;
  REF_BOOL accept;

  /* can't handle boundaries yet */
  if (!ref_cell_node_empty(ref_grid_tri(ref_grid), node) ||
      !ref_cell_node_empty(ref_grid_qua(ref_grid), node))
    return REF_SUCCESS;

  /* can't mixed elements */
  if (!ref_cell_node_empty(ref_grid_pyr(ref_grid), node) ||
      !ref_cell_node_empty(ref_grid_pri(ref_grid), node) ||
      !ref_cell_node_empty(ref_grid_hex(ref_grid), node))
    return REF_SUCCESS;

  for (ixyz = 0; ixyz < 3; ixyz++)
    original[ixyz] = ref_node_xyz(ref_node, ixyz, node);
  interp_guess = REF_EMPTY;
  if (NULL != ref_interp) {
    if (ref_interp_continuously(ref_interp)) {
      interp_guess = ref_interp_cell(ref_interp, node);
    }
  }

  RSS(ref_smooth_tet_quality_around(ref_grid, node, &quality0), "q");
  RSS(ref_smooth_tet_ratio_around(ref_grid, node, &min_ratio, &max_ratio),
      "ratio");
  pliant_smoothing = (quality0 > 0.5 && min_ratio > 0.5 && max_ratio < 2.0);

  if (pliant_smoothing) {
    RSS(ref_smooth_tet_pliant(ref_grid, node, ideal), "pliant");
  } else {
    RSS(ref_smooth_tet_weighted_ideal(ref_grid, node, ideal), "ideal");
  }
  backoff = 1.0;
  for (tries = 0; tries < 8; tries++) {
    for (ixyz = 0; ixyz < 3; ixyz++)
      ref_node_xyz(ref_node, ixyz, node) =
          backoff * ideal[ixyz] + (1.0 - backoff) * original[ixyz];
    interp_status = ref_metric_interpolate_node(ref_grid, node);
    RXS(interp_status, REF_NOT_FOUND, "ref_metric_interpolate_node failed");
    RSS(ref_smooth_tet_quality_around(ref_grid, node, &quality), "q");
    RSS(ref_smooth_tet_ratio_around(ref_grid, node, &min_ratio, &max_ratio),
        "ratio");
    accept = (REF_SUCCESS == interp_status);
    accept = accept && (min_ratio >= ref_grid_adapt(ref_grid, post_min_ratio));
    accept = accept && (max_ratio <= ref_grid_adapt(ref_grid, post_max_ratio));
    if (pliant_smoothing) {
      accept = accept && (quality > 0.9 * quality0);
      accept = accept && (quality > 0.4);
    } else {
      accept = accept && (quality > quality0);
    }
    if (accept) {
      return REF_SUCCESS;
    }
    backoff *= 0.5;
    if (REF_EMPTY != interp_guess && REF_SUCCESS != interp_status)
      ref_interp_cell(ref_interp, node) = interp_guess;
  }

  for (ixyz = 0; ixyz < 3; ixyz++)
    ref_node_xyz(ref_node, ixyz, node) = original[ixyz];
  RXS(ref_metric_interpolate_node(ref_grid, node), REF_NOT_FOUND, "interp");

  return REF_SUCCESS;
}